

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

void Js::JavascriptArray::InternalCopyNativeIntArrayElements
               (JavascriptArray *dstArray,uint32 dstIndex,JavascriptNativeIntArray *srcArray,
               uint32 start,uint32 end)

{
  code *pcVar1;
  undefined8 scriptContext_00;
  bool bVar2;
  uint32 uVar3;
  int nValue;
  undefined4 *puVar4;
  undefined1 local_68 [4];
  uint32 n;
  ArrayElementEnumerator e;
  ScriptContext *scriptContext;
  uint32 count;
  uint32 end_local;
  uint32 start_local;
  JavascriptNativeIntArray *srcArray_local;
  uint32 dstIndex_local;
  JavascriptArray *dstArray_local;
  Var local_10;
  
  if ((end <= start) ||
     ((srcArray->super_JavascriptNativeArray).super_JavascriptArray.super_ArrayObject.length < end))
  {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x2d6d,"(start < end && end <= srcArray->length)",
                                "start < end && end <= srcArray->length");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  scriptContext._4_4_ = 0;
  e._16_8_ = RecyclableObject::GetScriptContext((RecyclableObject *)dstArray);
  ArrayElementEnumerator::ArrayElementEnumerator
            ((ArrayElementEnumerator *)local_68,(JavascriptArray *)srcArray,start,end);
  while( true ) {
    bVar2 = ArrayElementEnumerator::MoveNext<int>((ArrayElementEnumerator *)local_68);
    if (!bVar2) break;
    uVar3 = ArrayElementEnumerator::GetIndex((ArrayElementEnumerator *)local_68);
    nValue = ArrayElementEnumerator::GetItem<int>((ArrayElementEnumerator *)local_68);
    scriptContext_00 = e._16_8_;
    bVar2 = TaggedInt::IsOverflow(nValue);
    if (bVar2) {
      local_10 = JavascriptNumber::NewInlined((double)nValue,(ScriptContext *)scriptContext_00);
    }
    else {
      local_10 = TaggedInt::ToVarUnchecked(nValue);
    }
    DirectSetItemAt<void*>(dstArray,dstIndex + (uVar3 - start),local_10);
    scriptContext._4_4_ = scriptContext._4_4_ + 1;
  }
  if (start + scriptContext._4_4_ != end) {
    InternalFillFromPrototype
              (dstArray,dstIndex,(JavascriptArray *)srcArray,start,end,scriptContext._4_4_);
  }
  return;
}

Assistant:

void JavascriptArray::InternalCopyNativeIntArrayElements(JavascriptArray* dstArray, uint32 dstIndex, JavascriptNativeIntArray* srcArray, uint32 start, uint32 end)
    {
        Assert(start < end && end <= srcArray->length);

        uint32 count = 0;

        // iterate on the array itself
        ScriptContext *scriptContext = dstArray->GetScriptContext();

        ArrayElementEnumerator e(srcArray, start, end);
        while(e.MoveNext<int32>())
        {
            uint32 n = dstIndex + (e.GetIndex() - start);
            dstArray->DirectSetItemAt(n, JavascriptNumber::ToVar(e.GetItem<int32>(), scriptContext));
            count++;
        }

        // iterate on the array's prototypes only if not all elements found
        if (start + count != end)
        {
            InternalFillFromPrototype(dstArray, dstIndex, srcArray, start, end, count);
        }
    }